

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

int * PeerArray(int MySize,int MyRank,int PeerSize)

{
  bool bVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = PeerSize % MySize;
  uVar6 = 0;
  bVar1 = MyRank < iVar5;
  if (MyRank < iVar5) {
    iVar5 = 0;
  }
  uVar3 = (uint)bVar1 + PeerSize / MySize;
  piVar2 = (int *)malloc((long)(int)uVar3 * 4 + 4);
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    piVar2[uVar6] = MyRank * uVar3 + iVar5 + (int)uVar6;
  }
  piVar2[(int)uVar3] = -1;
  return piVar2;
}

Assistant:

static int *PeerArray(int MySize, int MyRank, int PeerSize)
{
    int PortionSize = PeerSize / MySize;
    int Leftovers = PeerSize - PortionSize * MySize;
    int StartOffset = Leftovers;
    int Start;
    if (MyRank < Leftovers)
    {
        PortionSize++;
        StartOffset = 0;
    }
    Start = PortionSize * MyRank + StartOffset;
    int *MyPeers = malloc((PortionSize + 1) * sizeof(int));
    for (int i = 0; i < PortionSize; i++)
    {
        MyPeers[i] = Start + i;
    }
    MyPeers[PortionSize] = -1;

    return MyPeers;
}